

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::(anonymous_namespace)::SSLVersionTest_ClientSessionCacheMode_Test::
~SSLVersionTest_ClientSessionCacheMode_Test(SSLVersionTest_ClientSessionCacheMode_Test *this)

{
  anon_unknown_0::SSLVersionTest_ClientSessionCacheMode_Test::
  ~SSLVersionTest_ClientSessionCacheMode_Test
            ((SSLVersionTest_ClientSessionCacheMode_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(SSLVersionTest, ClientSessionCacheMode) {
  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_OFF);
  EXPECT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_CLIENT);
  EXPECT_TRUE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_SERVER);
  EXPECT_FALSE(CreateClientSession(client_ctx_.get(), server_ctx_.get()));
}